

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chameleon-core.cpp
# Opt level: O1

particles * read_particles(char *charfilename)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ostream *poVar3;
  particles *ppVar4;
  istream *piVar5;
  particle *ppVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<double,_std::allocator<double>_> v;
  double a;
  string filename;
  fstream fs;
  void *local_278;
  iterator iStack_270;
  double *local_268;
  double local_258;
  char *local_250;
  long local_248;
  char local_240 [16];
  double local_230 [4];
  byte abStack_210 [496];
  
  std::__cxx11::string::string((string *)&local_250,charfilename,(allocator *)local_230);
  std::fstream::fstream(local_230,(string *)&local_250,_S_in);
  if ((abStack_210[*(long *)((long)local_230[0] + -0x18)] & 5) == 0) {
    local_278 = (void *)0x0;
    iStack_270._M_current = (double *)0x0;
    local_268 = (double *)0x0;
    while( true ) {
      piVar5 = std::istream::_M_extract<double>(local_230);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      if (iStack_270._M_current == local_268) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_278,iStack_270,&local_258);
      }
      else {
        *iStack_270._M_current = local_258;
        iStack_270._M_current = iStack_270._M_current + 1;
      }
    }
    std::fstream::close();
    ppVar4 = (particles *)operator_new(0x10);
    pvVar2 = local_278;
    uVar9 = (long)iStack_270._M_current - (long)local_278 >> 3;
    uVar10 = uVar9 / 9;
    ppVar4->n = uVar10;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar8 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x48),8) == 0) {
      uVar8 = SUB168(auVar1 * ZEXT816(0x48),0);
    }
    ppVar6 = (particle *)operator_new__(uVar8);
    ppVar4->p = ppVar6;
    if (8 < uVar9) {
      lVar7 = 0x40;
      do {
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x40) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x40);
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x38) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x38);
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x30) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x30);
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x28) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x28);
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x20) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x20);
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x18) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x18);
        *(undefined8 *)((long)ppVar6 + lVar7 + -0x10) =
             *(undefined8 *)((long)pvVar2 + lVar7 + -0x10);
        *(undefined8 *)((long)ppVar6 + lVar7 + -8) = *(undefined8 *)((long)pvVar2 + lVar7 + -8);
        *(undefined8 *)((long)&ppVar6->q + lVar7) = *(undefined8 *)((long)pvVar2 + lVar7);
        lVar7 = lVar7 + 0x48;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"libchameleon: read_particles: ERROR: no such file, ",0x33);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_250,local_248);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::fstream::close();
    ppVar4 = (particles *)operator_new(0x10);
    ppVar4->n = 0;
    ppVar4->p = (particle *)0x0;
  }
  std::fstream::~fstream(local_230);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  return ppVar4;
}

Assistant:

particles* read_particles(const char* charfilename) { // char* ptype?
    string filename(charfilename);
    fstream fs(filename, ios_base::in);
    if (fs) {
        double a;
        std::vector<double> v;
        while (fs >> a) {
            v.push_back(a);
        }
        fs.close();
        particles* p = new particles;
        p -> n = v.size() / 9;
        p -> p = new particle[p -> n];
        for (long i = 0; i < v.size() / 9; ++i) {
            (p -> p)[i].q = v[9 * i];
            (p -> p)[i].x = v[9 * i + 1];
            (p -> p)[i].y = v[9 * i + 2];
            (p -> p)[i].z = v[9 * i + 3];
            (p -> p)[i].ux = v[9 * i + 4];
            (p -> p)[i].uy = v[9 * i + 5];
            (p -> p)[i].uz = v[9 * i + 6];
            (p -> p)[i].g = v[9 * i + 7];
            (p -> p)[i].chi = v[9 * i + 8];
        }
        return p;
    } else {
        cerr << "libchameleon: read_particles: ERROR: no such file, " << filename <<
            endl;
        fs.close();
        particles* p = new particles;
        p -> n = 0;
        p -> p = nullptr;
        return p;
    }
}